

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

UdpPortListSyntax * __thiscall slang::parsing::Parser::parseUdpPortList(Parser *this)

{
  Token closeParen_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token openParen_00;
  Token closeParen_01;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_00;
  Token openParen_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NonAnsiUdpPortListSyntax *pNVar3;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  EVP_PKEY_CTX *src_00;
  size_type extraout_RDX_00;
  Token TVar4;
  Token dotStar_00;
  Token closeParen_02;
  Token semi;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> local_288;
  Info *local_258;
  Info *pIStack_250;
  anon_class_8_1_8991fb9c local_240;
  undefined4 local_234;
  undefined1 local_230 [8];
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> ports_1;
  Token closeParen_2;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> local_178;
  Info *local_148;
  Info *pIStack_140;
  anon_class_8_1_8991fb9c local_120;
  undefined4 local_114;
  undefined1 local_110 [8];
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> ports;
  Token closeParen_1;
  Token closeParen;
  Token dotStar;
  Token openParen;
  Parser *this_local;
  
  TVar4 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  bVar1 = ParserBase::peek(&this->super_ParserBase,DotStar);
  dotStar.info = TVar4._0_8_;
  openParen._0_8_ = TVar4.info;
  if (bVar1) {
    dotStar_00 = ParserBase::consume(&this->super_ParserBase);
    closeParen_02 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::wildcardUdpPortList
                           (&this->factory,TVar4,dotStar_00,closeParen_02,semi);
  }
  else {
    bVar1 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
    if ((!bVar1) && (bVar1 = ParserBase::peek(&this->super_ParserBase,InputKeyword), !bVar1)) {
      Token::Token((Token *)(ports_1.stackBase + 0x40));
      SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
                ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_230);
      local_234 = 0x470005;
      local_240.this = this;
      ParserBase::
      parseList<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseUdpPortList()::__1>
                (&this->super_ParserBase,(SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_230,
                 CloseParenthesis,Comma,(Token *)(ports_1.stackBase + 0x40),True,(DiagCode)0x470005,
                 &local_240,False);
      local_258 = dotStar.info;
      pIStack_250 = (Info *)openParen._0_8_;
      iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_230,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
      elements.data_._4_4_ = extraout_var_00;
      elements.data_._0_4_ = iVar2;
      elements.size_ = extraout_RDX_00;
      slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::SeparatedSyntaxList
                (&local_288,elements);
      TVar4 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      openParen_00.info = pIStack_250;
      openParen_00._0_8_ = local_258;
      closeParen_00.info = (Info *)closeParen_2._0_8_;
      closeParen_00._0_8_ = ports_1.stackBase._64_8_;
      pNVar3 = slang::syntax::SyntaxFactory::nonAnsiUdpPortList
                         (&this->factory,openParen_00,&local_288,closeParen_00,TVar4);
      SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
                ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_230);
      return &pNVar3->super_UdpPortListSyntax;
    }
    Token::Token((Token *)(ports.stackBase + 0x40));
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_110);
    local_114 = 0x470005;
    local_120.this = this;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleUdpPort,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseUdpPortList()::__0>
              (&this->super_ParserBase,(SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_110,
               CloseParenthesis,Comma,(Token *)(ports.stackBase + 0x40),True,(DiagCode)0x470005,
               &local_120,False);
    local_148 = dotStar.info;
    pIStack_140 = (Info *)openParen._0_8_;
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_110,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
    elements_00.data_._4_4_ = extraout_var;
    elements_00.data_._0_4_ = iVar2;
    elements_00.size_ = extraout_RDX;
    slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::SeparatedSyntaxList
              (&local_178,elements_00);
    TVar4 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    openParen_01.info = pIStack_140;
    openParen_01._0_8_ = local_148;
    closeParen_01.info = (Info *)closeParen_1._0_8_;
    closeParen_01._0_8_ = ports.stackBase._64_8_;
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::ansiUdpPortList
                           (&this->factory,openParen_01,&local_178,closeParen_01,TVar4);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_110);
  }
  return (UdpPortListSyntax *)this_local;
}

Assistant:

UdpPortListSyntax& Parser::parseUdpPortList() {
    auto openParen = expect(TokenKind::OpenParenthesis);

    if (peek(TokenKind::DotStar)) {
        auto dotStar = consume();
        auto closeParen = expect(TokenKind::CloseParenthesis);
        return factory.wildcardUdpPortList(openParen, dotStar, closeParen,
                                           expect(TokenKind::Semicolon));
    }
    else if (peek(TokenKind::OutputKeyword) || peek(TokenKind::InputKeyword)) {
        Token closeParen;
        SmallVector<TokenOrSyntax, 4> ports;
        parseList<isPossibleUdpPort, isEndOfParenList>(ports, TokenKind::CloseParenthesis,
                                                       TokenKind::Comma, closeParen,
                                                       RequireItems::True, diag::ExpectedUdpPort,
                                                       [this] { return &parseUdpPortDecl(); });

        return factory.ansiUdpPortList(openParen, ports.copy(alloc), closeParen,
                                       expect(TokenKind::Semicolon));
    }
    else {
        Token closeParen;
        SmallVector<TokenOrSyntax, 4> ports;
        parseList<isIdentifierOrComma, isEndOfParenList>(
            ports, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::True,
            diag::ExpectedUdpPort, [this] { return &factory.identifierName(consume()); });

        return factory.nonAnsiUdpPortList(openParen, ports.copy(alloc), closeParen,
                                          expect(TokenKind::Semicolon));
    }
}